

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_band.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  N_Vector x_00;
  N_Vector y_00;
  undefined8 *puVar17;
  long in_RSI;
  int in_EDI;
  SUNContext sunctx;
  sunrealtype *ydata;
  sunrealtype *xdata;
  sunrealtype *colj;
  sunindextype jend;
  sunindextype jstart;
  sunindextype kend;
  sunindextype kstart;
  sunindextype k;
  sunindextype j;
  sunindextype i;
  int print_timing;
  N_Vector y;
  N_Vector x;
  SUNMatrix I;
  SUNMatrix A;
  sunindextype lband;
  sunindextype uband;
  sunindextype cols;
  int fails;
  long local_d0;
  long local_c8;
  long in_stack_ffffffffffffff40;
  SUNMatrix in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  SUNMatrix in_stack_ffffffffffffff68;
  SUNMatrix local_70;
  long local_68;
  long local_60;
  uint local_4;
  
  iVar2 = SUNContext_Create(0,&stack0xffffffffffffff50);
  if (iVar2 == 0) {
    if (in_EDI < 5) {
      printf(
            "ERROR: FOUR (4) Inputs required: matrix cols, matrux uband, matrix lband, print timing \n"
            );
      local_4 = 0xffffffff;
    }
    else {
      lVar10 = atol(*(char **)(in_RSI + 8));
      if (lVar10 < 1) {
        printf("ERROR: number of matrix columns must be a positive integer \n");
        local_4 = 0xffffffff;
      }
      else {
        lVar11 = atol(*(char **)(in_RSI + 0x10));
        if ((lVar11 < 1) || (lVar10 <= lVar11)) {
          printf(
                "ERROR: matrix upper bandwidth must be a positive integer, less than number of columns \n"
                );
          local_4 = 0xffffffff;
        }
        else {
          lVar12 = atol(*(char **)(in_RSI + 0x18));
          if ((lVar12 < 1) || (lVar10 <= lVar12)) {
            printf(
                  "ERROR: matrix lower bandwidth must be a positive integer, less than number of columns \n"
                  );
            local_4 = 0xffffffff;
          }
          else {
            iVar2 = atoi(*(char **)(in_RSI + 0x20));
            SetTiming(iVar2);
            printf("\nBand matrix test: size %ld, bandwidths %ld %ld\n\n",lVar10,lVar11,lVar12);
            uVar13 = SUNBandMatrix(lVar10,lVar11,lVar12,
                                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
            uVar14 = SUNBandMatrix(lVar10,0,0,
                                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
            uVar15 = N_VNew_Serial(lVar10,CONCAT44(in_stack_ffffffffffffff54,
                                                   in_stack_ffffffffffffff50));
            uVar16 = N_VNew_Serial(lVar10,CONCAT44(in_stack_ffffffffffffff54,
                                                   in_stack_ffffffffffffff50));
            x_00 = (N_Vector)N_VGetArrayPointer(uVar15);
            y_00 = (N_Vector)N_VGetArrayPointer(uVar16);
            for (local_68 = 0; local_68 < lVar10; local_68 = local_68 + 1) {
              puVar17 = (undefined8 *)SUNBandMatrix_Column(uVar14,local_68);
              *puVar17 = 0x3ff0000000000000;
              in_stack_ffffffffffffff68 = (SUNMatrix)SUNBandMatrix_Column(uVar13,local_68);
              lVar1 = lVar11;
              if (local_68 < lVar11) {
                lVar1 = local_68;
              }
              in_stack_ffffffffffffff48 = (SUNMatrix)-lVar1;
              local_70 = in_stack_ffffffffffffff48;
              in_stack_ffffffffffffff40 = lVar12;
              if ((lVar10 + -1) - lVar12 < local_68) {
                in_stack_ffffffffffffff40 = (lVar10 + -1) - local_68;
              }
              for (; (long)local_70 <= in_stack_ffffffffffffff40;
                  local_70 = (SUNMatrix)((long)&local_70->content + 1)) {
                (&in_stack_ffffffffffffff68->content)[(long)local_70] =
                     (void *)(double)(local_68 - (long)local_70);
              }
            }
            for (local_60 = 0; local_60 < lVar10; local_60 = local_60 + 1) {
              (&x_00->content)[local_60] = (void *)(double)local_60;
              (&y_00->content)[local_60] = (void *)0x0;
              if (local_60 - lVar12 < 0) {
                local_c8 = 0;
              }
              else {
                local_c8 = local_60 - lVar12;
              }
              if (lVar10 + -1 < local_60 + lVar11) {
                local_d0 = lVar10 + -1;
              }
              else {
                local_d0 = local_60 + lVar11;
              }
              for (local_68 = local_c8; local_68 <= local_d0; local_68 = local_68 + 1) {
                (&y_00->content)[local_60] =
                     (void *)((double)((local_68 * 2 - local_60) * local_68) +
                             (double)(&y_00->content)[local_60]);
              }
            }
            iVar2 = Test_SUNMatGetID(in_stack_ffffffffffffff48,
                                     (SUNMatrix_ID)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                                     (int)in_stack_ffffffffffffff40);
            iVar9 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
            iVar3 = Test_SUNMatClone(in_stack_ffffffffffffff48,iVar9);
            iVar4 = Test_SUNMatCopy(in_stack_ffffffffffffff48,iVar9);
            iVar5 = Test_SUNMatZero(in_stack_ffffffffffffff48,iVar9);
            iVar6 = Test_SUNMatScaleAdd(in_stack_ffffffffffffff68,(SUNMatrix)x_00,
                                        (int)((ulong)y_00 >> 0x20));
            iVar7 = Test_SUNMatScaleAddI
                              ((SUNMatrix)y_00,
                               (SUNMatrix)
                               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                               (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
            iVar8 = Test_SUNMatMatvec(in_stack_ffffffffffffff68,x_00,y_00,in_stack_ffffffffffffff54)
            ;
            iVar9 = Test_SUNMatSpace(in_stack_ffffffffffffff48,iVar9);
            local_4 = iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2;
            if (local_4 == 0) {
              printf("SUCCESS: SUNMatrix module passed all tests \n \n");
            }
            else {
              printf("FAIL: SUNMatrix module failed %i tests \n \n",(ulong)local_4);
              printf("\nA =\n");
              SUNBandMatrix_Print(uVar13,_stdout);
              printf("\nI =\n");
              SUNBandMatrix_Print(uVar14,_stdout);
              printf("\nx =\n");
              N_VPrint_Serial(uVar15);
              printf("\ny =\n");
              N_VPrint_Serial(uVar16);
            }
            SUNMatDestroy(uVar13);
            SUNMatDestroy(uVar14);
            N_VDestroy(uVar15);
            N_VDestroy(uVar16);
            SUNContext_Free(&stack0xffffffffffffff50);
          }
        }
      }
    }
  }
  else {
    printf("ERROR: SUNContext_Create failed\n");
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails = 0;                   /* counter for test failures  */
  sunindextype cols, uband, lband; /* matrix columns, bandwidths */
  SUNMatrix A, I;                  /* test matrices              */
  N_Vector x, y;                   /* test vectors               */
  int print_timing;
  sunindextype i, j, k, kstart, kend, jstart, jend;
  sunrealtype *colj, *xdata, *ydata;
  SUNContext sunctx;

  if (SUNContext_Create(SUN_COMM_NULL, &sunctx))
  {
    printf("ERROR: SUNContext_Create failed\n");
    return (-1);
  }

  /* check input and set vector length */
  if (argc < 5)
  {
    printf("ERROR: FOUR (4) Inputs required: matrix cols, matrux uband, matrix "
           "lband, print timing \n");
    return (-1);
  }

  cols = (sunindextype)atol(argv[1]);
  if (cols <= 0)
  {
    printf("ERROR: number of matrix columns must be a positive integer \n");
    return (-1);
  }

  uband = (sunindextype)atol(argv[2]);
  if ((uband <= 0) || (uband >= cols))
  {
    printf("ERROR: matrix upper bandwidth must be a positive integer, less "
           "than number of columns \n");
    return (-1);
  }

  lband = (sunindextype)atol(argv[3]);
  if ((lband <= 0) || (lband >= cols))
  {
    printf("ERROR: matrix lower bandwidth must be a positive integer, less "
           "than number of columns \n");
    return (-1);
  }

  print_timing = atoi(argv[4]);
  SetTiming(print_timing);

  printf("\nBand matrix test: size %ld, bandwidths %ld %ld\n\n", (long int)cols,
         (long int)uband, (long int)lband);

  /* Initialize vectors and matrices to NULL */
  x = NULL;
  y = NULL;
  A = NULL;
  I = NULL;

  /* Create matrices and vectors */
  A = SUNBandMatrix(cols, uband, lband, sunctx);
  I = SUNBandMatrix(cols, 0, 0, sunctx);
  x = N_VNew_Serial(cols, sunctx);
  y = N_VNew_Serial(cols, sunctx);

  /* Fill matrices */
  xdata = N_VGetArrayPointer(x);
  ydata = N_VGetArrayPointer(y);
  for (j = 0; j < cols; j++)
  {
    /* identity matrix */
    colj    = SUNBandMatrix_Column(I, j);
    colj[0] = SUN_RCONST(1.0);

    /* A matrix */
    colj   = SUNBandMatrix_Column(A, j);
    kstart = (j < uband) ? -j : -uband;
    kend   = (j > cols - 1 - lband) ? cols - 1 - j : lband;
    for (k = kstart; k <= kend; k++)
    {
      colj[k] = j - k; /* A(i,j) = j + (j-i) */
    }
  }

  /* Fill vectors */
  for (i = 0; i < cols; i++)
  {
    /* x vector */
    xdata[i] = i;

    /* y vector */
    ydata[i] = SUN_RCONST(0.0);
    jstart   = SUNMAX(0, i - lband);
    jend     = SUNMIN(cols - 1, i + uband);
    for (j = jstart; j <= jend; j++) { ydata[i] += (j + j - i) * (j); }
  }

  /* Run Tests */
  fails += Test_SUNMatGetID(A, SUNMATRIX_BAND, 0);
  fails += Test_SUNMatClone(A, 0);
  fails += Test_SUNMatCopy(A, 0);
  fails += Test_SUNMatZero(A, 0);
  fails += Test_SUNMatScaleAdd(A, I, 0);
  fails += Test_SUNMatScaleAddI(A, I, 0);
  fails += Test_SUNMatMatvec(A, x, y, 0);
  fails += Test_SUNMatSpace(A, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNMatrix module failed %i tests \n \n", fails);
    printf("\nA =\n");
    SUNBandMatrix_Print(A, stdout);
    printf("\nI =\n");
    SUNBandMatrix_Print(I, stdout);
    printf("\nx =\n");
    N_VPrint_Serial(x);
    printf("\ny =\n");
    N_VPrint_Serial(y);
  }
  else { printf("SUCCESS: SUNMatrix module passed all tests \n \n"); }

  /* Free matrices and vectors */
  SUNMatDestroy(A);
  SUNMatDestroy(I);
  N_VDestroy(x);
  N_VDestroy(y);
  SUNContext_Free(&sunctx);

  return (fails);
}